

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O0

bool __thiscall Datetime::validate(Datetime *this)

{
  int iVar1;
  int iVar2;
  int wke;
  int wks;
  Datetime *this_local;
  
  iVar2 = 6;
  if (weekstart == 1) {
    iVar2 = 7;
  }
  if ((((((this->_year == 0) || ((0x76b < this->_year && (this->_year < 10000)))) &&
        ((this->_month == 0 || ((0 < this->_month && (this->_month < 0xd)))))) &&
       ((((this->_week == 0 || ((0 < this->_week && (this->_week < 0x36)))) &&
         ((int)(uint)(weekstart == 1) <= this->_weekday)) && (this->_weekday <= iVar2)))) &&
      (((this->_julian == 0 ||
        ((0 < this->_julian &&
         (iVar2 = this->_julian, iVar1 = daysInYear(this->_year), iVar2 <= iVar1)))) &&
       ((this->_day == 0 ||
        ((0 < this->_day &&
         (iVar2 = this->_day, iVar1 = daysInMonth(this->_year,this->_month), iVar2 <= iVar1))))))))
     && (((this->_seconds == 0 || ((0 < this->_seconds && (this->_seconds < 0x15181)))) &&
         ((this->_offset == 0 || ((-0x15181 < this->_offset && (this->_offset < 0x15181)))))))) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Datetime::validate ()
{
  // for ISO 8601 week specification: YYYY-Www-D where D is 1-7 (Mon-Sun)
  int wks = (Datetime::weekstart == 1 ? 1: 0);
  int wke = (Datetime::weekstart == 1 ? 7: 6);

  // _year;
  if ((_year    && (_year    <   1900 || _year    >                                  9999)) ||
      (_month   && (_month   <      1 || _month   >                                    12)) ||
      (_week    && (_week    <      1 || _week    >                                    53)) ||
      (true     && (_weekday <    wks || _weekday >                                   wke)) ||
      (_julian  && (_julian  <      1 || _julian  >          Datetime::daysInYear (_year))) ||
      (_day     && (_day     <      1 || _day     > Datetime::daysInMonth (_year, _month))) ||
      (_seconds && (_seconds <      1 || _seconds >                                 86400)) ||
      (_offset  && (_offset  < -86400 || _offset  >                                 86400)))
    return false;

  return true;
}